

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_clrsb_i32_sparc64(TCGContext_conflict8 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg)

{
  TCGv_i32 ret_00;
  uintptr_t o;
  
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_sari_i32_sparc64(tcg_ctx,ret_00,arg,0x1f);
  tcg_gen_xor_i32(tcg_ctx,ret_00,ret_00,arg);
  tcg_gen_clzi_i32_sparc64(tcg_ctx,ret_00,ret_00,0x20);
  tcg_gen_subi_i32_sparc64(tcg_ctx,ret,ret_00,1);
  tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_clrsb_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg)
{
    if (TCG_TARGET_HAS_clz_i32) {
        TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_sari_i32(tcg_ctx, t, arg, 31);
        tcg_gen_xor_i32(tcg_ctx, t, t, arg);
        tcg_gen_clzi_i32(tcg_ctx, t, t, 32);
        tcg_gen_subi_i32(tcg_ctx, ret, t, 1);
        tcg_temp_free_i32(tcg_ctx, t);
    } else {
        gen_helper_clrsb_i32(tcg_ctx, ret, arg);
    }
}